

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O3

int xmlXPathNotEqualValues(xmlXPathParserContextPtr ctxt)

{
  xmlGenericErrorFunc p_Var1;
  xmlXPathObjectType *pxVar2;
  xmlXPathObjectType xVar3;
  uint uVar4;
  int iVar5;
  xmlXPathObjectPtr arg2;
  xmlXPathObjectPtr arg1;
  xmlGenericErrorFunc *pp_Var6;
  void **ppvVar7;
  xmlXPathObjectPtr arg2_00;
  
  uVar4 = 0;
  if ((ctxt != (xmlXPathParserContextPtr)0x0) && (ctxt->context != (xmlXPathContextPtr)0x0)) {
    arg2 = valuePop(ctxt);
    arg1 = valuePop(ctxt);
    if (arg2 == (xmlXPathObjectPtr)0x0 || arg1 == (xmlXPathObjectPtr)0x0) {
      if (arg1 != (xmlXPathObjectPtr)0x0) {
        arg2 = arg1;
      }
      xmlXPathReleaseObject(ctxt->context,arg2);
      xmlXPathErr(ctxt,10);
    }
    else {
      arg2_00 = arg1;
      uVar4 = 0;
      if (arg1 != arg2) {
        pxVar2 = &arg2->type;
        if ((*pxVar2 | XPATH_USERS) == XPATH_XSLT_TREE) {
          xVar3 = arg1->type;
        }
        else {
          xVar3 = arg1->type;
          if ((xVar3 | XPATH_USERS) != XPATH_XSLT_TREE) {
            iVar5 = xmlXPathEqualValuesCommon(ctxt,arg1,arg2);
            return (uint)(iVar5 == 0);
          }
        }
        if ((xVar3 | XPATH_USERS) == XPATH_XSLT_TREE) {
          arg2_00 = arg2;
          arg2 = arg1;
          xVar3 = *pxVar2;
        }
        uVar4 = 0;
        switch(xVar3) {
        case XPATH_NODESET:
        case XPATH_XSLT_TREE:
          uVar4 = xmlXPathEqualNodeSets(arg2,arg2_00,1);
          break;
        case XPATH_BOOLEAN:
          uVar4 = 0;
          if (arg2->nodesetval != (xmlNodeSetPtr)0x0) {
            uVar4 = (uint)(arg2->nodesetval->nodeNr != 0);
          }
          uVar4 = (uint)(uVar4 != arg2_00->boolval);
          break;
        case XPATH_NUMBER:
          uVar4 = xmlXPathEqualNodeSetFloat(ctxt,arg2,arg2_00->floatval,1);
          break;
        case XPATH_STRING:
          uVar4 = xmlXPathEqualNodeSetString(arg2,arg2_00->stringval,1);
          break;
        case XPATH_USERS:
          pp_Var6 = __xmlGenericError();
          p_Var1 = *pp_Var6;
          ppvVar7 = __xmlGenericErrorContext();
          uVar4 = 0;
          (*p_Var1)(*ppvVar7,"Unimplemented block at %s:%d\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/frida[P]libxml2/xpath.c"
                    ,0x1c96);
        }
        xmlXPathReleaseObject(ctxt->context,arg2);
      }
      xmlXPathReleaseObject(ctxt->context,arg2_00);
    }
  }
  return uVar4;
}

Assistant:

int
xmlXPathNotEqualValues(xmlXPathParserContextPtr ctxt) {
    xmlXPathObjectPtr arg1, arg2, argtmp;
    int ret = 0;

    if ((ctxt == NULL) || (ctxt->context == NULL)) return(0);
    arg2 = valuePop(ctxt);
    arg1 = valuePop(ctxt);
    if ((arg1 == NULL) || (arg2 == NULL)) {
	if (arg1 != NULL)
	    xmlXPathReleaseObject(ctxt->context, arg1);
	else
	    xmlXPathReleaseObject(ctxt->context, arg2);
	XP_ERROR0(XPATH_INVALID_OPERAND);
    }

    if (arg1 == arg2) {
#ifdef DEBUG_EXPR
        xmlGenericError(xmlGenericErrorContext,
		"NotEqual: by pointer\n");
#endif
	xmlXPathReleaseObject(ctxt->context, arg1);
        return(0);
    }

    /*
     *If either argument is a nodeset, it's a 'special case'
     */
    if ((arg2->type == XPATH_NODESET) || (arg2->type == XPATH_XSLT_TREE) ||
      (arg1->type == XPATH_NODESET) || (arg1->type == XPATH_XSLT_TREE)) {
	/*
	 *Hack it to assure arg1 is the nodeset
	 */
	if ((arg1->type != XPATH_NODESET) && (arg1->type != XPATH_XSLT_TREE)) {
		argtmp = arg2;
		arg2 = arg1;
		arg1 = argtmp;
	}
	switch (arg2->type) {
	    case XPATH_UNDEFINED:
#ifdef DEBUG_EXPR
		xmlGenericError(xmlGenericErrorContext,
			"NotEqual: undefined\n");
#endif
		break;
	    case XPATH_NODESET:
	    case XPATH_XSLT_TREE:
		ret = xmlXPathEqualNodeSets(arg1, arg2, 1);
		break;
	    case XPATH_BOOLEAN:
		if ((arg1->nodesetval == NULL) ||
		  (arg1->nodesetval->nodeNr == 0)) ret = 0;
		else
		    ret = 1;
		ret = (ret != arg2->boolval);
		break;
	    case XPATH_NUMBER:
		ret = xmlXPathEqualNodeSetFloat(ctxt, arg1, arg2->floatval, 1);
		break;
	    case XPATH_STRING:
		ret = xmlXPathEqualNodeSetString(arg1, arg2->stringval,1);
		break;
	    case XPATH_USERS:
#ifdef LIBXML_XPTR_LOCS_ENABLED
	    case XPATH_POINT:
	    case XPATH_RANGE:
	    case XPATH_LOCATIONSET:
#endif /* LIBXML_XPTR_LOCS_ENABLED */
		TODO
		break;
	}
	xmlXPathReleaseObject(ctxt->context, arg1);
	xmlXPathReleaseObject(ctxt->context, arg2);
	return(ret);
    }

    return (!xmlXPathEqualValuesCommon(ctxt, arg1, arg2));
}